

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::RegexpReplaceBindData::Copy(RegexpReplaceBindData *this)

{
  Options options;
  RegexpReplaceBindData *this_00;
  long in_RSI;
  string local_40;
  
  this_00 = (RegexpReplaceBindData *)operator_new(0x48);
  options = *(Options *)(in_RSI + 8);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,*(long *)(in_RSI + 0x20),
             *(long *)(in_RSI + 0x28) + *(long *)(in_RSI + 0x20));
  RegexpReplaceBindData(this_00,options,&local_40,*(bool *)(in_RSI + 0x40),*(bool *)(in_RSI + 0x41))
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_RegexpBaseBindData).super_FunctionData._vptr_FunctionData = (_func_int **)this_00;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> RegexpReplaceBindData::Copy() const {
	auto copy = make_uniq<RegexpReplaceBindData>(options, constant_string, constant_pattern, global_replace);
	return std::move(copy);
}